

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.cpp
# Opt level: O0

Float * __thiscall blc::math::Float::operator/(Float *this,Float *i)

{
  int iVar1;
  Float *in_RDX;
  Float *in_RSI;
  Float *in_RDI;
  double tmp;
  int diff;
  Float *ret;
  Float *in_stack_ffffffffffffff98;
  Float *i_00;
  int local_1c;
  
  i_00 = in_RDI;
  Float(in_RDI);
  local_1c = in_RSI->_E;
  iVar1 = getE(in_RDX);
  local_1c = local_1c - iVar1;
  getNb(in_RDX);
  while (local_1c != 0) {
    if (local_1c < 0) {
      local_1c = local_1c + 1;
    }
    else {
      local_1c = local_1c + -1;
    }
  }
  Float(in_RSI,(double)i_00,(int)((ulong)in_RDI >> 0x20));
  operator=(in_RDI,in_stack_ffffffffffffff98);
  return i_00;
}

Assistant:

blc::math::Float blc::math::Float::operator/(const blc::math::Float &i) const {
	blc::math::Float ret;
	int diff = this->_E - i.getE();
	double tmp = i.getNb();

	while (diff != 0) {
		if (diff < 0) {
			tmp *= 10;
			diff++;
		} else {
			tmp /= 10;
			diff--;
		}
	}
	ret = blc::math::Float(this->_nb / tmp, this->_E);
	return (ret);
}